

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPCollisionList::UpdateAddress
          (RTPCollisionList *this,RTPAddress *addr,RTPTime *receivetime,bool *created)

{
  size_t *psVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  if (addr == (RTPAddress *)0x0) {
    return -3;
  }
  p_Var6 = (_List_node_base *)&this->addresslist;
  do {
    p_Var6 = (((_List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)&this->addresslist) {
      iVar4 = (**addr->_vptr_RTPAddress)(addr,(this->super_RTPMemoryObject).mgr);
      if ((_List_node_base *)CONCAT44(extraout_var,iVar4) == (_List_node_base *)0x0) {
        return -1;
      }
      p_Var6 = (_List_node_base *)receivetime->m_t;
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = (_List_node_base *)CONCAT44(extraout_var,iVar4);
      p_Var5[1]._M_prev = p_Var6;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->addresslist).
                super__List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      bVar3 = true;
      goto LAB_0012c75d;
    }
    cVar2 = (**(code **)(*(long *)p_Var6[1]._M_next + 8))(p_Var6[1]._M_next,addr);
  } while (cVar2 == '\0');
  p_Var6[1]._M_prev = (_List_node_base *)receivetime->m_t;
  bVar3 = false;
LAB_0012c75d:
  *created = bVar3;
  return 0;
}

Assistant:

int RTPCollisionList::UpdateAddress(const RTPAddress *addr,const RTPTime &receivetime,bool *created)
{
	if (addr == 0)
		return ERR_RTP_COLLISIONLIST_BADADDRESS;
	
	std::list<AddressAndTime>::iterator it;
	
	for (it = addresslist.begin() ; it != addresslist.end() ; it++)
	{
		if (((*it).addr)->IsSameAddress(addr))
		{
			(*it).recvtime = receivetime;
			*created = false;
			return 0;
		}
	}

	RTPAddress *newaddr = addr->CreateCopy(GetMemoryManager());
	if (newaddr == 0)
		return ERR_RTP_OUTOFMEM;
	
	addresslist.push_back(AddressAndTime(newaddr,receivetime));
	*created = true;
	return 0;
}